

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O0

int testFileWriterTestsWriteToFile(void)

{
  allocator<unsigned_char> *paVar1;
  allocator<float> *paVar2;
  initializer_list<unsigned_char> __l;
  initializer_list<float> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  bool bVar3;
  string *psVar4;
  size_type sVar5;
  iterator ptVar6;
  iterator ptVar7;
  iterator ptVar8;
  iterator ptVar9;
  ostream *poVar10;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  SpanSize<18446744073709551615UL> extraout_RDX;
  SpanSize<18446744073709551615UL> extraout_RDX_00;
  SpanSize<18446744073709551615UL> extraout_RDX_01;
  SpanSize<18446744073709551615UL> in_R8;
  Span<const_unsigned_char,_18446744073709551615UL> SVar11;
  Span<const_unsigned_char,_18446744073709551615UL> SVar12;
  Span<unsigned_char,_18446744073709551615UL> SVar13;
  Span<const_float,_18446744073709551615UL> SVar14;
  Span<float,_18446744073709551615UL> SVar15;
  Span<unsigned_char,_18446744073709551615UL> data;
  Span<unsigned_char,_18446744073709551615UL> data_00;
  undefined1 auStack_918 [8];
  Span<unsigned_char,_18446744073709551615UL> outputOldSpan;
  undefined1 local_900 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> outputOld;
  Span<const_unsigned_char,_18446744073709551615UL> oldExpectedSpan;
  undefined1 local_8c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> oldExpected;
  undefined1 auStack_898 [8];
  Span<float,_18446744073709551615UL> outputSpan_2;
  undefined1 local_880 [8];
  vector<float,_std::allocator<float>_> output_2;
  undefined1 local_840 [8];
  FileWriter writer_2;
  Span<const_float,_18446744073709551615UL> expectedSpan_2;
  float local_618 [8];
  iterator local_5f8;
  size_type local_5f0;
  undefined1 local_5e8 [8];
  vector<float,_std::allocator<float>_> expected_2;
  uint64_t offset_2;
  undefined1 auStack_5b8 [8];
  Span<unsigned_char,_18446744073709551615UL> outputSpan_1;
  undefined1 local_5a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output_1;
  undefined1 local_568 [8];
  FileWriter writer_1;
  Span<const_unsigned_char,_18446744073709551615UL> expectedSpan_1;
  undefined1 local_330 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_1;
  uint64_t offset_1;
  undefined1 auStack_2f8 [8];
  Span<unsigned_char,_18446744073709551615UL> outputSpan;
  undefined1 local_2e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  undefined1 local_2a0 [8];
  FileWriter writer;
  Span<const_unsigned_char,_18446744073709551615UL> expectedSpan;
  allocator<unsigned_char> local_6d;
  uchar local_6c [4];
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  uint64_t offset;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)&offset);
  expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builtin_memcpy(local_6c,"\n\x14\x1e(",4);
  local_68 = local_6c;
  local_60 = 4;
  std::allocator<unsigned_char>::allocator(&local_6d);
  __l_02._M_len = local_60;
  __l_02._M_array = local_68;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,__l_02,&local_6d);
  std::allocator<unsigned_char>::~allocator(&local_6d);
  SVar11 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  writer._520_8_ = SVar11.m_ptr;
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&offset);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_2a0,psVar4,true);
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)writer._520_8_;
  SVar12.m_size.m_size = extraout_RDX.m_size;
  SVar12.m_ptr = (pointer)SVar11.m_size.m_size.m_size;
  SVar12 = MILBlob::Util::SpanCast<unsigned_char_const,unsigned_char_const>
                     ((Util *)writer._520_8_,SVar12);
  MILBlob::Blob::FileWriter::WriteData
            ((FileWriter *)local_2a0,SVar12,
             (uint64_t)
             expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_2a0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  paVar1 = (allocator<unsigned_char> *)((long)&outputSpan.m_size.m_size + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e0,sVar5,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&outputSpan.m_size.m_size + 7));
  SVar13 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e0);
  outputSpan.m_ptr = (pointer)SVar13.m_size.m_size;
  auStack_2f8 = (undefined1  [8])SVar13.m_ptr;
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&offset);
  SVar13.m_size.m_size = in_R8.m_size;
  SVar13.m_ptr = outputSpan.m_ptr;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar4,
             (string *)
             expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(uint64_t)auStack_2f8,SVar13);
  ptVar6 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                     ((Span<const_unsigned_char,_18446744073709551615UL> *)&writer.field_0x208);
  ptVar7 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end
                     ((Span<const_unsigned_char,_18446744073709551615UL> *)&writer.field_0x208);
  ptVar8 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                     ((Span<unsigned_char,_18446744073709551615UL> *)auStack_2f8);
  ptVar9 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                     ((Span<unsigned_char,_18446744073709551615UL> *)auStack_2f8);
  bVar3 = std::equal<unsigned_char_const*,unsigned_char*>(ptVar6,ptVar7,ptVar8,ptVar9);
  if (!bVar3) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x39);
    poVar10 = std::operator<<(poVar10,": error: ");
    poVar10 = std::operator<<(poVar10,
                              "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                             );
    poVar10 = std::operator<<(poVar10," was false, expected true.");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    tempfile._36_4_ = 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  if (bVar3) {
    expected_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expectedSpan_1.m_size.m_size._4_1_ = 10;
    expectedSpan_1.m_size.m_size._5_1_ = 0x14;
    expectedSpan_1.m_size.m_size._6_1_ = 0x1e;
    expectedSpan_1.m_size.m_size._7_1_ = 0x28;
    paVar1 = (allocator<unsigned_char> *)((long)&expectedSpan_1.m_size.m_size + 3);
    std::allocator<unsigned_char>::allocator(paVar1);
    __l_01._M_len = 4;
    __l_01._M_array = (iterator)((long)&expectedSpan_1.m_size.m_size + 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_330,__l_01,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)((long)&expectedSpan_1.m_size.m_size + 3));
    SVar12 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_330);
    expectedSpan_1.m_ptr = (pointer)SVar12.m_size.m_size;
    writer_1._520_8_ = SVar12.m_ptr;
    psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                       ((AutoDeleteTempFile *)&offset);
    MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_568,psVar4,false);
    output_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)writer_1._520_8_;
    SVar11.m_size.m_size = extraout_RDX_00.m_size;
    SVar11.m_ptr = expectedSpan_1.m_ptr;
    SVar12 = MILBlob::Util::SpanCast<unsigned_char_const,unsigned_char_const>
                       ((Util *)writer_1._520_8_,SVar11);
    MILBlob::Blob::FileWriter::WriteData
              ((FileWriter *)local_568,SVar12,
               (uint64_t)
               expected_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_568);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_330);
    paVar1 = (allocator<unsigned_char> *)((long)&outputSpan_1.m_size.m_size + 7);
    std::allocator<unsigned_char>::allocator(paVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5a0,sVar5,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)((long)&outputSpan_1.m_size.m_size + 7));
    SVar13 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5a0);
    outputSpan_1.m_ptr = (pointer)SVar13.m_size.m_size;
    auStack_5b8 = (undefined1  [8])SVar13.m_ptr;
    psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                       ((AutoDeleteTempFile *)&offset);
    data.m_size.m_size = in_R8.m_size;
    data.m_ptr = outputSpan_1.m_ptr;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar4,
               (string *)
               expected_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(uint64_t)auStack_5b8,data);
    ptVar6 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)&writer_1.field_0x208);
    ptVar7 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)&writer_1.field_0x208);
    ptVar8 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                       ((Span<unsigned_char,_18446744073709551615UL> *)auStack_5b8);
    ptVar9 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                       ((Span<unsigned_char,_18446744073709551615UL> *)auStack_5b8);
    bVar3 = std::equal<unsigned_char_const*,unsigned_char*>(ptVar6,ptVar7,ptVar8,ptVar9);
    if (!bVar3) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x48);
      poVar10 = std::operator<<(poVar10,": error: ");
      poVar10 = std::operator<<(poVar10,
                                "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                               );
      poVar10 = std::operator<<(poVar10," was false, expected true.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      tempfile._36_4_ = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_330);
    if (bVar3) {
      expected_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x40;
      local_618[0] = 1.235;
      local_618[1] = 5.674;
      local_618[2] = 642.0;
      local_618[3] = 891.41;
      local_618[4] = 14124.14;
      local_5f8 = local_618;
      local_5f0 = 5;
      paVar2 = (allocator<float> *)((long)&expectedSpan_2.m_size.m_size + 7);
      std::allocator<float>::allocator(paVar2);
      __l_00._M_len = local_5f0;
      __l_00._M_array = local_5f8;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_5e8,__l_00,paVar2);
      std::allocator<float>::~allocator
                ((allocator<float> *)((long)&expectedSpan_2.m_size.m_size + 7));
      SVar14 = MILBlob::Util::MakeSpan<float,_std::vector,_std::allocator<float>_>
                         ((vector<float,_std::allocator<float>_> *)local_5e8);
      expectedSpan_2.m_ptr = (pointer)SVar14.m_size.m_size;
      writer_2._520_8_ = SVar14.m_ptr;
      psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                         ((AutoDeleteTempFile *)&offset);
      MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_840,psVar4,false);
      output_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)writer_2._520_8_;
      SVar14.m_size.m_size = extraout_RDX_01.m_size;
      SVar14.m_ptr = expectedSpan_2.m_ptr;
      SVar12 = MILBlob::Util::SpanCast<unsigned_char_const,float_const>
                         ((Util *)writer_2._520_8_,SVar14);
      MILBlob::Blob::FileWriter::WriteData
                ((FileWriter *)local_840,SVar12,
                 (uint64_t)
                 expected_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_840);
      sVar5 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_5e8);
      paVar2 = (allocator<float> *)((long)&outputSpan_2.m_size.m_size + 7);
      std::allocator<float>::allocator(paVar2);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_880,sVar5,paVar2);
      std::allocator<float>::~allocator((allocator<float> *)((long)&outputSpan_2.m_size.m_size + 7))
      ;
      SVar15 = MILBlob::Util::MakeSpan<float,_std::vector,_std::allocator<float>_>
                         ((vector<float,_std::allocator<float>_> *)local_880);
      outputSpan_2.m_ptr = (pointer)SVar15.m_size.m_size;
      auStack_898 = (undefined1  [8])SVar15.m_ptr;
      psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                         ((AutoDeleteTempFile *)&offset);
      oldExpected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)auStack_898;
      SVar15.m_size.m_size = in_R8.m_size;
      SVar15.m_ptr = outputSpan_2.m_ptr;
      MILBlob::TestUtil::ReadBlobFile<float>
                ((TestUtil *)psVar4,
                 (string *)
                 expected_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(uint64_t)auStack_898,SVar15);
      __first1 = MILBlob::Util::Span<const_float,_18446744073709551615UL>::begin
                           ((Span<const_float,_18446744073709551615UL> *)&writer_2.field_0x208);
      __last1 = MILBlob::Util::Span<const_float,_18446744073709551615UL>::end
                          ((Span<const_float,_18446744073709551615UL> *)&writer_2.field_0x208);
      __first2 = MILBlob::Util::Span<float,_18446744073709551615UL>::begin
                           ((Span<float,_18446744073709551615UL> *)auStack_898);
      __last2 = MILBlob::Util::Span<float,_18446744073709551615UL>::end
                          ((Span<float,_18446744073709551615UL> *)auStack_898);
      bVar3 = std::equal<float_const*,float*>(__first1,__last1,__first2,__last2);
      if (bVar3) {
        oldExpectedSpan.m_size.m_size._4_1_ = 10;
        oldExpectedSpan.m_size.m_size._5_1_ = 0x14;
        oldExpectedSpan.m_size.m_size._6_1_ = 0x1e;
        oldExpectedSpan.m_size.m_size._7_1_ = 0x28;
        paVar1 = (allocator<unsigned_char> *)((long)&oldExpectedSpan.m_size.m_size + 3);
        std::allocator<unsigned_char>::allocator(paVar1);
        __l._M_len = 4;
        __l._M_array = (iterator)((long)&oldExpectedSpan.m_size.m_size + 4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8c0,__l,paVar1);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)((long)&oldExpectedSpan.m_size.m_size + 3));
        SVar12 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8c0);
        oldExpectedSpan.m_ptr = (pointer)SVar12.m_size.m_size;
        outputOld.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = SVar12.m_ptr;
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8c0);
        paVar1 = (allocator<unsigned_char> *)((long)&outputOldSpan.m_size.m_size + 7);
        std::allocator<unsigned_char>::allocator(paVar1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_900,sVar5,paVar1);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)((long)&outputOldSpan.m_size.m_size + 7));
        SVar13 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_900);
        outputOldSpan.m_ptr = (pointer)SVar13.m_size.m_size;
        auStack_918 = (undefined1  [8])SVar13.m_ptr;
        psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                           ((AutoDeleteTempFile *)&offset);
        data_00.m_size.m_size = in_R8.m_size;
        data_00.m_ptr = outputOldSpan.m_ptr;
        MILBlob::TestUtil::ReadBlobFile<unsigned_char>
                  ((TestUtil *)psVar4,(string *)0x0,(uint64_t)auStack_918,data_00);
        ptVar6 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                           ((Span<const_unsigned_char,_18446744073709551615UL> *)
                            &outputOld.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        ptVar7 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end
                           ((Span<const_unsigned_char,_18446744073709551615UL> *)
                            &outputOld.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        ptVar8 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                           ((Span<unsigned_char,_18446744073709551615UL> *)auStack_918);
        ptVar9 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                           ((Span<unsigned_char,_18446744073709551615UL> *)auStack_918);
        bVar3 = std::equal<unsigned_char_const*,unsigned_char*>(ptVar6,ptVar7,ptVar8,ptVar9);
        if (!bVar3) {
          poVar10 = std::operator<<((ostream *)&std::cout,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,":");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x5f);
          poVar10 = std::operator<<(poVar10,": error: ");
          poVar10 = std::operator<<(poVar10,
                                    "std::equal(oldExpectedSpan.begin(), oldExpectedSpan.end(), outputOldSpan.begin(), outputOldSpan.end())"
                                   );
          poVar10 = std::operator<<(poVar10," was false, expected true.");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          tempfile._36_4_ = 1;
        }
        bVar3 = !bVar3;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_900);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8c0);
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x57);
        poVar10 = std::operator<<(poVar10,": error: ");
        poVar10 = std::operator<<(poVar10,
                                  "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                                 );
        poVar10 = std::operator<<(poVar10," was false, expected true.");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        tempfile._36_4_ = 1;
        bVar3 = true;
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_880);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_5e8);
      if (!bVar3) {
        tempfile._36_4_ = 0;
      }
    }
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&offset);
  return tempfile._36_4_;
}

Assistant:

int testFileWriterTestsWriteToFile()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to empty file without truncating
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to existing file without truncating
    {
        uint64_t offset = 64;
        const std::vector<float> expected{1.235f, 5.674f, 642.f, 891.41f, 14124.14f};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<float> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<float>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Ensure earlier written data is present as well
        const std::vector<uint8_t> oldExpected{10, 20, 30, 40};
        auto oldExpectedSpan = Util::MakeSpan(oldExpected);
        std::vector<uint8_t> outputOld(oldExpected.size());
        auto outputOldSpan = Util::MakeSpan(outputOld);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputOldSpan);
        ML_ASSERT_SPAN_EQ(oldExpectedSpan, outputOldSpan);
    }

    return 0;
}